

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Object_State_Header::Object_State_Header
          (Object_State_Header *this,EntityIdentifier *ObjID,EntityIdentifier *RefObjID,
          KUINT16 UpdateNum,ForceID FI)

{
  ForceID FI_local;
  KUINT16 UpdateNum_local;
  EntityIdentifier *RefObjID_local;
  EntityIdentifier *ObjID_local;
  Object_State_Header *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Object_State_Header_0033a980;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ObjID,ObjID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RefObjID,RefObjID);
  this->m_ui16UpdateNum = UpdateNum;
  this->m_ui8ForceID = (KUINT8)FI;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Object_State_Header::Object_State_Header( const EntityIdentifier & ObjID, const EntityIdentifier & RefObjID ,
        KUINT16 UpdateNum, ForceID FI ) :
    m_ObjID( ObjID ),
    m_RefObjID( RefObjID ),
    m_ui16UpdateNum( UpdateNum ),
    m_ui8ForceID( FI )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}